

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O2

bool __thiscall
pybind11::detail::
list_caster<std::vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>,_std::shared_ptr<kratos::Var>_>
::load(list_caster<std::vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>,_std::shared_ptr<kratos::Var>_>
       *this,handle src,bool convert)

{
  handle hVar1;
  bool bVar2;
  bool bVar3;
  handle hVar4;
  sequence_iterator sVar5;
  undefined1 local_a0 [8];
  value_conv conv;
  reference it;
  handle local_40;
  handle local_38;
  sequence s;
  
  bVar2 = sequence::check_(src);
  if (bVar2) {
    if (src.m_ptr == (PyObject *)0x0) {
      local_38.m_ptr = (PyObject *)0x0;
    }
    else {
      if (((src.m_ptr)->ob_type->tp_flags & 0x18000000) != 0) goto LAB_0034c5c0;
      (src.m_ptr)->ob_refcnt = (src.m_ptr)->ob_refcnt + 1;
      local_38.m_ptr = src.m_ptr;
    }
    std::vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>::clear
              (&this->value);
    reserve_maybe<std::vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>,_0>
              (this,(sequence *)&local_38,&this->value);
    hVar1.m_ptr = local_38.m_ptr;
    sVar5 = sequence::end((sequence *)&local_38);
    it.cache.super_handle.m_ptr = (handle)sVar5.super_sequence_slow_readwrite.index;
    for (hVar4.m_ptr = (PyObject *)0x0; bVar2 = it.cache.super_handle.m_ptr == (handle)hVar4.m_ptr,
        !bVar2; hVar4.m_ptr = (PyObject *)((long)&(hVar4.m_ptr)->ob_refcnt + 1)) {
      it._0_8_ = hVar1.m_ptr;
      it.key = 0;
      it.obj.m_ptr = hVar4.m_ptr;
      copyable_holder_caster<kratos::Var,_std::shared_ptr<kratos::Var>,_void>::
      copyable_holder_caster
                ((copyable_holder_caster<kratos::Var,_std::shared_ptr<kratos::Var>,_void> *)local_a0
                );
      accessor::operator_cast_to_object((accessor *)&local_40);
      bVar3 = type_caster_generic::
              load_impl<pybind11::detail::copyable_holder_caster<kratos::Var,std::shared_ptr<kratos::Var>,void>>
                        ((type_caster_generic *)local_a0,local_40,convert);
      object::~object((object *)&local_40);
      if (!bVar3) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &conv.
                    super_copyable_holder_caster<kratos::Var,_std::shared_ptr<kratos::Var>,_void>.
                    holder);
        object::~object((object *)&it.key);
        break;
      }
      std::vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>::
      push_back(&this->value,
                (value_type *)
                &conv.super_copyable_holder_caster<kratos::Var,_std::shared_ptr<kratos::Var>,_void>.
                 super_type_caster_base<kratos::Var>.super_type_caster_generic.value);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &conv.super_copyable_holder_caster<kratos::Var,_std::shared_ptr<kratos::Var>,_void>
                  .holder);
      object::~object((object *)&it.key);
    }
    object::~object((object *)&local_38);
  }
  else {
LAB_0034c5c0:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<sequence>(src) || isinstance<bytes>(src) || isinstance<str>(src))
            return false;
        auto s = reinterpret_borrow<sequence>(src);
        value.clear();
        reserve_maybe(s, &value);
        for (auto it : s) {
            value_conv conv;
            if (!conv.load(it, convert))
                return false;
            value.push_back(cast_op<Value &&>(std::move(conv)));
        }
        return true;
    }